

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii.c
# Opt level: O0

int verify_eol_type(coda_ascii_product *product_file,eol_type end_of_line)

{
  char *pcVar1;
  char *pcVar2;
  eol_type end_of_line_local;
  coda_ascii_product *product_file_local;
  
  if (end_of_line != eol_unknown) {
    if (product_file->end_of_line == eol_unknown) {
      product_file->end_of_line = end_of_line;
      product_file_local._4_4_ = 0;
    }
    else if (product_file->end_of_line == end_of_line) {
      product_file_local._4_4_ = 0;
    }
    else {
      pcVar1 = eol_type_to_string(end_of_line);
      pcVar2 = eol_type_to_string(product_file->end_of_line);
      coda_set_error(-300,
                     "product error detected (inconsistent end-of-line sequence - got %s but expected %s)"
                     ,pcVar1,pcVar2);
      product_file_local._4_4_ = -1;
    }
    return product_file_local._4_4_;
  }
  __assert_fail("end_of_line != eol_unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascii.c"
                ,0x9c,"int verify_eol_type(coda_ascii_product *, eol_type)");
}

Assistant:

static int verify_eol_type(coda_ascii_product *product_file, eol_type end_of_line)
{
    assert(end_of_line != eol_unknown);

    if (product_file->end_of_line == eol_unknown)
    {
        product_file->end_of_line = end_of_line;
        return 0;
    }

    if (product_file->end_of_line != end_of_line)
    {
        coda_set_error(CODA_ERROR_PRODUCT,
                       "product error detected (inconsistent end-of-line sequence - got %s but expected %s)",
                       eol_type_to_string(end_of_line), eol_type_to_string(product_file->end_of_line));
        return -1;
    }

    return 0;
}